

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xc_functional_test.cxx
# Opt level: O0

void check_correctness<double,ExchCXX::Kernel,double,ExchCXX::Kernel>
               (TestInterface interface,Backend backend,Spin polar,double *args,Kernel *args_1,
               double *args_2,Kernel *args_3)

{
  double dVar1;
  anon_class_16_2_625aa075 __gen;
  anon_class_16_2_625aa075 __gen_00;
  anon_class_16_2_625aa075 __gen_01;
  anon_class_16_2_625aa075 __gen_02;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  bool bVar2;
  undefined1 uVar3;
  anon_class_8_1_505f5cd8 aVar4;
  size_t sVar5;
  const_host_buffer_type sigma_00;
  const_host_buffer_type tau_00;
  const_host_buffer_type sigma_01;
  double *pdVar6;
  double *pdVar7;
  size_type sVar8;
  reference pvVar9;
  reference pvVar10;
  int in_EDI;
  ExprLhs<double> lhs;
  undefined8 in_stack_00000008;
  AssertionHandler catchAssertionHandler_4;
  unsigned_long j_4;
  double ref_val_4;
  unsigned_long i_4;
  AssertionHandler catchAssertionHandler_3;
  unsigned_long j_3;
  double ref_val_3;
  unsigned_long i_3;
  AssertionHandler catchAssertionHandler_2;
  unsigned_long j_2;
  double ref_val_2;
  unsigned_long i_2;
  AssertionHandler catchAssertionHandler_1;
  unsigned_long j_1;
  double ref_val_1;
  unsigned_long i_1;
  AssertionHandler catchAssertionHandler;
  unsigned_long j;
  double ref_val;
  unsigned_long i;
  vector<double,_std::allocator<double>_> vtau;
  vector<double,_std::allocator<double>_> vlapl;
  vector<double,_std::allocator<double>_> vsigma;
  vector<double,_std::allocator<double>_> vrho;
  vector<double,_std::allocator<double>_> eps;
  XCKernel *kern;
  pair<double,_ExchCXX::XCKernel> p;
  iterator __end0;
  iterator __begin0;
  vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
  *__range1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  vtau_refs;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  vlapl_refs;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  vsigma_refs;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  vrho_refs;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  eps_refs;
  normal_distribution<double> dist;
  default_random_engine gen;
  vector<double,_std::allocator<double>_> tau;
  vector<double,_std::allocator<double>_> lapl;
  vector<double,_std::allocator<double>_> sigma;
  vector<double,_std::allocator<double>_> rho;
  size_t npts;
  vector<double,_std::allocator<double>_> coeffs;
  XCFunctional func;
  vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
  kern_pairs;
  undefined4 uVar11;
  undefined4 uVar12;
  pair<double,_ExchCXX::XCKernel> *__rhs;
  __normal_iterator<std::pair<double,_ExchCXX::XCKernel>_*,_std::vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>_>
  in_stack_fffffffffffff4a0;
  __normal_iterator<std::pair<double,_ExchCXX::XCKernel>_*,_std::vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>_>
  in_stack_fffffffffffff4a8;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffff4b0;
  double **in_stack_fffffffffffff4b8;
  Approx *in_stack_fffffffffffff4c0;
  ExprLhs<double> *in_stack_fffffffffffff4c8;
  Flags resultDisposition;
  double **in_stack_fffffffffffff4d0;
  Kernel *in_stack_fffffffffffff4d8;
  value_type vVar13;
  XCKernel *in_stack_fffffffffffff4e0;
  ulong uVar14;
  undefined8 in_stack_fffffffffffff4e8;
  double **in_stack_fffffffffffff500;
  double **in_stack_fffffffffffff508;
  double **in_stack_fffffffffffff510;
  undefined7 in_stack_fffffffffffff518;
  undefined1 in_stack_fffffffffffff51f;
  double **in_stack_fffffffffffff520;
  host_buffer_type in_stack_fffffffffffff5c0;
  host_buffer_type in_stack_fffffffffffff5c8;
  const_host_buffer_type in_stack_fffffffffffff5d0;
  undefined8 in_stack_fffffffffffff5d8;
  int N;
  undefined4 in_stack_fffffffffffff5e0;
  undefined4 in_stack_fffffffffffff5e4;
  host_buffer_type in_stack_fffffffffffff618;
  undefined7 in_stack_fffffffffffff620;
  const_host_buffer_type rho_00;
  int N_00;
  XCFunctional *this_00;
  host_buffer_type vsigma_00;
  double *lapl_00;
  int N_01;
  XCFunctional *this_01;
  vector<double,_std::allocator<double>_> *eps_00;
  vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
  *vsigma_01;
  host_buffer_type in_stack_fffffffffffff728;
  host_buffer_type in_stack_fffffffffffff730;
  SourceLineInfo local_868;
  StringRef local_858;
  ulong local_800;
  double local_7f8;
  ulong local_7f0;
  double local_7c0;
  StringRef local_788;
  SourceLineInfo local_778;
  StringRef local_768;
  ulong local_710;
  double local_708;
  ulong local_700;
  double local_6d0;
  StringRef local_698;
  SourceLineInfo local_688;
  StringRef local_678;
  ulong local_620;
  double local_618;
  ulong local_610;
  double local_5e0;
  StringRef local_5a8;
  SourceLineInfo local_598;
  StringRef local_588;
  ulong local_530;
  double local_528;
  ulong local_520;
  double local_4f0;
  StringRef local_4b8;
  SourceLineInfo local_4a8;
  StringRef local_498;
  ulong local_440;
  double local_438;
  ulong local_430;
  undefined1 local_421 [32];
  undefined1 local_401 [32];
  undefined1 local_3e1 [33];
  vector<double,_std::allocator<double>_> local_3c0;
  vector<double,_std::allocator<double>_> local_3a0;
  double *local_388;
  double *local_380;
  double *local_378;
  undefined1 local_370 [48];
  pair<double,_ExchCXX::XCKernel> local_340;
  IResultCapture *local_330;
  double *local_328;
  double *local_320;
  double *local_318;
  double *local_310;
  double *local_308;
  pair<double,_ExchCXX::XCKernel> local_300;
  double *local_2f0;
  double *local_2e8;
  double *local_2e0;
  double *local_2d8;
  double *local_2d0;
  double *local_2c8;
  double *local_2c0;
  double *local_2b8;
  size_t local_2b0;
  size_t local_2a8;
  size_t local_2a0;
  size_t local_298;
  size_t local_290;
  undefined1 *local_288;
  undefined1 local_278 [8];
  pair<double,_ExchCXX::XCKernel> *local_270;
  __normal_iterator<std::pair<double,_ExchCXX::XCKernel>_*,_std::vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>_>
  local_268;
  vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
  *local_260;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_258;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_240;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_228;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_210;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_1f8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  double *local_1d0;
  double *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  double *local_1b0;
  double *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  double *local_190;
  double *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  double *local_170;
  double *local_168;
  undefined1 local_160 [32];
  undefined1 local_140 [47];
  double local_111 [4];
  double local_f1 [4];
  XCFunctional local_d1;
  size_t local_b8;
  vector<double,_std::allocator<double>_> *local_b0;
  vector<double,_std::allocator<double>_> *local_a8;
  pair<double,_ExchCXX::XCKernel> *local_a0;
  pair<double,_ExchCXX::XCKernel> *local_98;
  vector<double,_std::allocator<double>_> local_90;
  XCFunctional local_68;
  vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
  local_50 [2];
  int local_14;
  SourceLineInfo *this;
  
  uVar11 = (undefined4)in_stack_00000008;
  uVar12 = (undefined4)((ulong)in_stack_00000008 >> 0x20);
  vsigma_01 = local_50;
  local_14 = in_EDI;
  gen_kern_vector<double,ExchCXX::Kernel,double,ExchCXX::Kernel>
            ((Backend)((ulong)in_stack_fffffffffffff4e8 >> 0x20),(Spin)in_stack_fffffffffffff4e8,
             (double *)in_stack_fffffffffffff4e0,in_stack_fffffffffffff4d8,
             (double *)in_stack_fffffffffffff4d0,(Kernel *)in_stack_fffffffffffff500);
  ExchCXX::XCFunctional::XCFunctional
            ((XCFunctional *)in_stack_fffffffffffff4a0._M_current,
             (vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
              *)CONCAT44(uVar12,uVar11));
  eps_00 = &local_90;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x174da4);
  local_98 = (pair<double,_ExchCXX::XCKernel> *)
             std::
             vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
             ::begin((vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                      *)CONCAT44(uVar12,uVar11));
  local_a0 = (pair<double,_ExchCXX::XCKernel> *)
             std::
             vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
             ::end((vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                    *)CONCAT44(uVar12,uVar11));
  aVar4.coeffs._4_4_ = uVar12;
  aVar4.coeffs._0_4_ = uVar11;
  local_a8 = eps_00;
  aVar4 = std::
          for_each<__gnu_cxx::__normal_iterator<std::pair<double,ExchCXX::XCKernel>*,std::vector<std::pair<double,ExchCXX::XCKernel>,std::allocator<std::pair<double,ExchCXX::XCKernel>>>>,check_correctness<double,ExchCXX::Kernel,double,ExchCXX::Kernel>(TestInterface,ExchCXX::Backend,ExchCXX::Spin,double&&,ExchCXX::Kernel&&,double&&,ExchCXX::Kernel&&)::_lambda(auto:1_const&)_1_>
                    (in_stack_fffffffffffff4a8,in_stack_fffffffffffff4a0,aVar4);
  local_b8 = 0x400;
  local_b0 = (vector<double,_std::allocator<double>_> *)aVar4;
  sVar5 = ExchCXX::XCFunctional::rho_buffer_len
                    ((XCFunctional *)in_stack_fffffffffffff4b0._M_current,
                     (size_t)in_stack_fffffffffffff4a8._M_current);
  this_01 = &local_d1;
  std::allocator<double>::allocator((allocator<double> *)0x174e5e);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff4c0,
             (size_type)in_stack_fffffffffffff4b8,
             (allocator_type *)in_stack_fffffffffffff4b0._M_current);
  std::allocator<double>::~allocator((allocator<double> *)0x174e8a);
  sigma_00 = (const_host_buffer_type)
             ExchCXX::XCFunctional::sigma_buffer_len
                       ((XCFunctional *)in_stack_fffffffffffff4c0,(size_t)in_stack_fffffffffffff4b8)
  ;
  pdVar6 = local_f1;
  std::allocator<double>::allocator((allocator<double> *)0x174ebc);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff4c0,
             (size_type)in_stack_fffffffffffff4b8,
             (allocator_type *)in_stack_fffffffffffff4b0._M_current);
  std::allocator<double>::~allocator((allocator<double> *)0x174ee8);
  tau_00 = (const_host_buffer_type)
           ExchCXX::XCFunctional::lapl_buffer_len
                     ((XCFunctional *)in_stack_fffffffffffff4b0._M_current,
                      (size_t)in_stack_fffffffffffff4a8._M_current);
  lapl_00 = local_111;
  std::allocator<double>::allocator((allocator<double> *)0x174f1a);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff4c0,
             (size_type)in_stack_fffffffffffff4b8,
             (allocator_type *)in_stack_fffffffffffff4b0._M_current);
  std::allocator<double>::~allocator((allocator<double> *)0x174f46);
  ExchCXX::XCFunctional::tau_buffer_len
            ((XCFunctional *)in_stack_fffffffffffff4b0._M_current,
             (size_t)in_stack_fffffffffffff4a8._M_current);
  std::allocator<double>::allocator((allocator<double> *)0x174f78);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff4c0,
             (size_type)in_stack_fffffffffffff4b8,
             (allocator_type *)in_stack_fffffffffffff4b0._M_current);
  std::allocator<double>::~allocator((allocator<double> *)0x174fa4);
  std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>::
  linear_congruential_engine
            ((linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)0x174fb1);
  std::normal_distribution<double>::normal_distribution
            ((normal_distribution<double> *)in_stack_fffffffffffff4b0._M_current,
             (result_type)in_stack_fffffffffffff4a8._M_current,
             (result_type)in_stack_fffffffffffff4a0._M_current);
  local_168 = (double *)
              std::vector<double,_std::allocator<double>_>::begin
                        ((vector<double,_std::allocator<double>_> *)CONCAT44(uVar12,uVar11));
  local_170 = (double *)
              std::vector<double,_std::allocator<double>_>::end
                        ((vector<double,_std::allocator<double>_> *)CONCAT44(uVar12,uVar11));
  local_180 = local_160;
  local_178 = local_140;
  __gen.dist._4_4_ = uVar12;
  __gen.dist._0_4_ = uVar11;
  __gen.gen = (default_random_engine *)in_stack_fffffffffffff4a0._M_current;
  std::
  generate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,check_correctness<double,ExchCXX::Kernel,double,ExchCXX::Kernel>(TestInterface,ExchCXX::Backend,ExchCXX::Spin,double&&,ExchCXX::Kernel&&,double&&,ExchCXX::Kernel&&)::_lambda()_1_>
            (in_stack_fffffffffffff4b0,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             in_stack_fffffffffffff4a8._M_current,__gen);
  local_188 = (double *)
              std::vector<double,_std::allocator<double>_>::begin
                        ((vector<double,_std::allocator<double>_> *)CONCAT44(uVar12,uVar11));
  local_190 = (double *)
              std::vector<double,_std::allocator<double>_>::end
                        ((vector<double,_std::allocator<double>_> *)CONCAT44(uVar12,uVar11));
  local_1a0 = local_160;
  local_198 = local_140;
  __gen_00.dist._4_4_ = uVar12;
  __gen_00.dist._0_4_ = uVar11;
  __gen_00.gen = (default_random_engine *)in_stack_fffffffffffff4a0._M_current;
  std::
  generate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,check_correctness<double,ExchCXX::Kernel,double,ExchCXX::Kernel>(TestInterface,ExchCXX::Backend,ExchCXX::Spin,double&&,ExchCXX::Kernel&&,double&&,ExchCXX::Kernel&&)::_lambda()_2_>
            (in_stack_fffffffffffff4b0,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             in_stack_fffffffffffff4a8._M_current,__gen_00);
  local_1a8 = (double *)
              std::vector<double,_std::allocator<double>_>::begin
                        ((vector<double,_std::allocator<double>_> *)CONCAT44(uVar12,uVar11));
  local_1b0 = (double *)
              std::vector<double,_std::allocator<double>_>::end
                        ((vector<double,_std::allocator<double>_> *)CONCAT44(uVar12,uVar11));
  local_1c0 = local_160;
  local_1b8 = local_140;
  __gen_01.dist._4_4_ = uVar12;
  __gen_01.dist._0_4_ = uVar11;
  __gen_01.gen = (default_random_engine *)in_stack_fffffffffffff4a0._M_current;
  std::
  generate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,check_correctness<double,ExchCXX::Kernel,double,ExchCXX::Kernel>(TestInterface,ExchCXX::Backend,ExchCXX::Spin,double&&,ExchCXX::Kernel&&,double&&,ExchCXX::Kernel&&)::_lambda()_3_>
            (in_stack_fffffffffffff4b0,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             in_stack_fffffffffffff4a8._M_current,__gen_01);
  local_1c8 = (double *)
              std::vector<double,_std::allocator<double>_>::begin
                        ((vector<double,_std::allocator<double>_> *)CONCAT44(uVar12,uVar11));
  local_1d0 = (double *)
              std::vector<double,_std::allocator<double>_>::end
                        ((vector<double,_std::allocator<double>_> *)CONCAT44(uVar12,uVar11));
  local_1e0 = local_160;
  local_1d8 = local_140;
  __gen_02.dist._4_4_ = uVar12;
  __gen_02.dist._0_4_ = uVar11;
  __gen_02.gen = (default_random_engine *)in_stack_fffffffffffff4a0._M_current;
  std::
  generate<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,check_correctness<double,ExchCXX::Kernel,double,ExchCXX::Kernel>(TestInterface,ExchCXX::Backend,ExchCXX::Spin,double&&,ExchCXX::Kernel&&,double&&,ExchCXX::Kernel&&)::_lambda()_4_>
            (in_stack_fffffffffffff4b0,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             in_stack_fffffffffffff4a8._M_current,__gen_02);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x1751c3);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x1751d0);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x1751dd);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x1751ea);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x1751f7);
  local_260 = local_50;
  local_268._M_current =
       (pair<double,_ExchCXX::XCKernel> *)
       std::
       vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
       ::begin((vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                *)CONCAT44(uVar12,uVar11));
  local_270 = (pair<double,_ExchCXX::XCKernel> *)
              std::
              vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
              ::end((vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                     *)CONCAT44(uVar12,uVar11));
  __rhs = (pair<double,_ExchCXX::XCKernel> *)CONCAT44(uVar12,uVar11);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::pair<double,_ExchCXX::XCKernel>_*,_std::vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>_>
                        *)in_stack_fffffffffffff4a0._M_current,
                       (__normal_iterator<std::pair<double,_ExchCXX::XCKernel>_*,_std::vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>_>
                        *)__rhs);
    N_01 = (int)(sVar5 >> 0x20);
    N = (int)((ulong)in_stack_fffffffffffff5d8 >> 0x20);
    if (!bVar2) break;
    __gnu_cxx::
    __normal_iterator<std::pair<double,_ExchCXX::XCKernel>_*,_std::vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>_>
    ::operator*(&local_268);
    std::pair<double,_ExchCXX::XCKernel>::pair(in_stack_fffffffffffff4a0._M_current,__rhs);
    local_288 = local_278;
    local_290 = ExchCXX::XCKernel::exc_buffer_len
                          ((XCKernel *)in_stack_fffffffffffff4a0._M_current,(size_t)__rhs);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::emplace_back<unsigned_long>
              ((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)in_stack_fffffffffffff4b0._M_current,
               (unsigned_long *)in_stack_fffffffffffff4a8._M_current);
    local_298 = ExchCXX::XCKernel::vrho_buffer_len
                          ((XCKernel *)in_stack_fffffffffffff4a0._M_current,(size_t)__rhs);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::emplace_back<unsigned_long>
              ((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)in_stack_fffffffffffff4b0._M_current,
               (unsigned_long *)in_stack_fffffffffffff4a8._M_current);
    local_2a0 = ExchCXX::XCKernel::vsigma_buffer_len
                          ((XCKernel *)in_stack_fffffffffffff4a0._M_current,(size_t)__rhs);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::emplace_back<unsigned_long>
              ((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)in_stack_fffffffffffff4b0._M_current,
               (unsigned_long *)in_stack_fffffffffffff4a8._M_current);
    local_2a8 = ExchCXX::XCKernel::vlapl_buffer_len
                          ((XCKernel *)in_stack_fffffffffffff4a0._M_current,(size_t)__rhs);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::emplace_back<unsigned_long>
              ((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)in_stack_fffffffffffff4b0._M_current,
               (unsigned_long *)in_stack_fffffffffffff4a8._M_current);
    local_2b0 = ExchCXX::XCKernel::vtau_buffer_len
                          ((XCKernel *)in_stack_fffffffffffff4a0._M_current,(size_t)__rhs);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::emplace_back<unsigned_long>
              ((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)in_stack_fffffffffffff4b0._M_current,
               (unsigned_long *)in_stack_fffffffffffff4a8._M_current);
    if (local_14 == 0) {
      bVar2 = ExchCXX::XCKernel::is_lda((XCKernel *)0x17539d);
      if (bVar2) {
        local_2b8 = std::vector<double,_std::allocator<double>_>::data
                              ((vector<double,_std::allocator<double>_> *)0x1753c3);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)in_stack_fffffffffffff4a0._M_current);
        local_2c0 = std::vector<double,_std::allocator<double>_>::data
                              ((vector<double,_std::allocator<double>_> *)0x1753e0);
        ExchCXX::XCKernel::eval_exc<unsigned_long&,double*,double*>
                  ((XCKernel *)in_stack_fffffffffffff4b0._M_current,
                   (unsigned_long *)in_stack_fffffffffffff4a8._M_current,
                   (double **)in_stack_fffffffffffff4a0._M_current,(double **)__rhs);
      }
      else {
        bVar2 = ExchCXX::XCKernel::is_gga((XCKernel *)0x175543);
        if (bVar2) {
          local_2c8 = std::vector<double,_std::allocator<double>_>::data
                                ((vector<double,_std::allocator<double>_> *)0x175569);
          local_2d0 = std::vector<double,_std::allocator<double>_>::data
                                ((vector<double,_std::allocator<double>_> *)0x17557e);
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)in_stack_fffffffffffff4a0._M_current);
          local_2d8 = std::vector<double,_std::allocator<double>_>::data
                                ((vector<double,_std::allocator<double>_> *)0x17559b);
          ExchCXX::XCKernel::eval_exc<unsigned_long&,double*,double*,double*>
                    ((XCKernel *)in_stack_fffffffffffff4b0._M_current,
                     (unsigned_long *)in_stack_fffffffffffff4a8._M_current,
                     (double **)in_stack_fffffffffffff4a0._M_current,(double **)__rhs,
                     (double **)0x1755d0);
        }
        else {
          bVar2 = ExchCXX::XCKernel::is_mgga((XCKernel *)0x1755e4);
          if (bVar2) {
            local_2e0 = std::vector<double,_std::allocator<double>_>::data
                                  ((vector<double,_std::allocator<double>_> *)0x17560a);
            local_2e8 = std::vector<double,_std::allocator<double>_>::data
                                  ((vector<double,_std::allocator<double>_> *)0x17561f);
            local_2f0 = std::vector<double,_std::allocator<double>_>::data
                                  ((vector<double,_std::allocator<double>_> *)0x175634);
            local_300.second.pimpl_._M_t.
            super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
            ._M_t.
            super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
            .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl =
                 (impl_ptr)
                 std::vector<double,_std::allocator<double>_>::data
                           ((vector<double,_std::allocator<double>_> *)0x175649);
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)in_stack_fffffffffffff4a0._M_current);
            local_300.first =
                 (double)std::vector<double,_std::allocator<double>_>::data
                                   ((vector<double,_std::allocator<double>_> *)0x175666);
            __rhs = &local_300;
            ExchCXX::XCKernel::eval_exc<unsigned_long&,double*,double*,double*,double*,double*>
                      ((XCKernel *)in_stack_fffffffffffff4c0,
                       (unsigned_long *)in_stack_fffffffffffff4b8,
                       (double **)in_stack_fffffffffffff4b0._M_current,
                       (double **)in_stack_fffffffffffff4a8._M_current,
                       (double **)in_stack_fffffffffffff4a0._M_current,(double **)__rhs,
                       in_stack_fffffffffffff4d0);
          }
        }
      }
    }
    else if (local_14 == 1) {
      bVar2 = ExchCXX::XCKernel::is_lda((XCKernel *)0x1756d9);
      if (bVar2) {
        local_308 = std::vector<double,_std::allocator<double>_>::data
                              ((vector<double,_std::allocator<double>_> *)0x1756ff);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)in_stack_fffffffffffff4a0._M_current);
        local_310 = std::vector<double,_std::allocator<double>_>::data
                              ((vector<double,_std::allocator<double>_> *)0x17571c);
        std::
        vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ::back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)in_stack_fffffffffffff4a0._M_current);
        local_318 = std::vector<double,_std::allocator<double>_>::data
                              ((vector<double,_std::allocator<double>_> *)0x175739);
        ExchCXX::XCKernel::eval_exc_vxc<unsigned_long&,double*,double*,double*>
                  ((XCKernel *)in_stack_fffffffffffff4b0._M_current,
                   (unsigned_long *)in_stack_fffffffffffff4a8._M_current,
                   (double **)in_stack_fffffffffffff4a0._M_current,(double **)__rhs,
                   (double **)0x17576e);
      }
      else {
        bVar2 = ExchCXX::XCKernel::is_gga((XCKernel *)0x175782);
        if (bVar2) {
          local_320 = std::vector<double,_std::allocator<double>_>::data
                                ((vector<double,_std::allocator<double>_> *)0x1757a8);
          local_328 = std::vector<double,_std::allocator<double>_>::data
                                ((vector<double,_std::allocator<double>_> *)0x1757bd);
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)in_stack_fffffffffffff4a0._M_current);
          local_330 = (IResultCapture *)
                      std::vector<double,_std::allocator<double>_>::data
                                ((vector<double,_std::allocator<double>_> *)0x1757da);
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)in_stack_fffffffffffff4a0._M_current);
          local_340.second.pimpl_._M_t.
          super___uniq_ptr_impl<ExchCXX::detail::XCKernelImpl,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
          ._M_t.
          super__Tuple_impl<0UL,_ExchCXX::detail::XCKernelImpl_*,_std::default_delete<ExchCXX::detail::XCKernelImpl>_>
          .super__Head_base<0UL,_ExchCXX::detail::XCKernelImpl_*,_false>._M_head_impl =
               (impl_ptr)
               std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x1757f7);
          std::
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)in_stack_fffffffffffff4a0._M_current);
          local_340.first =
               (double)std::vector<double,_std::allocator<double>_>::data
                                 ((vector<double,_std::allocator<double>_> *)0x175814);
          __rhs = &local_340;
          ExchCXX::XCKernel::eval_exc_vxc<unsigned_long&,double*,double*,double*,double*,double*>
                    ((XCKernel *)in_stack_fffffffffffff4c0,
                     (unsigned_long *)in_stack_fffffffffffff4b8,
                     (double **)in_stack_fffffffffffff4b0._M_current,
                     (double **)in_stack_fffffffffffff4a8._M_current,
                     (double **)in_stack_fffffffffffff4a0._M_current,(double **)__rhs,
                     in_stack_fffffffffffff4d0);
        }
        else {
          bVar2 = ExchCXX::XCKernel::is_mgga((XCKernel *)0x175873);
          if (bVar2) {
            local_370._40_8_ =
                 std::vector<double,_std::allocator<double>_>::data
                           ((vector<double,_std::allocator<double>_> *)0x175899);
            local_370._32_8_ =
                 std::vector<double,_std::allocator<double>_>::data
                           ((vector<double,_std::allocator<double>_> *)0x1758ae);
            local_370._24_8_ =
                 std::vector<double,_std::allocator<double>_>::data
                           ((vector<double,_std::allocator<double>_> *)0x1758c3);
            local_370._16_8_ =
                 std::vector<double,_std::allocator<double>_>::data
                           ((vector<double,_std::allocator<double>_> *)0x1758d8);
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)in_stack_fffffffffffff4a0._M_current);
            local_370._8_8_ =
                 std::vector<double,_std::allocator<double>_>::data
                           ((vector<double,_std::allocator<double>_> *)0x1758f5);
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)in_stack_fffffffffffff4a0._M_current);
            local_370._0_8_ =
                 std::vector<double,_std::allocator<double>_>::data
                           ((vector<double,_std::allocator<double>_> *)0x175912);
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)in_stack_fffffffffffff4a0._M_current);
            local_378 = std::vector<double,_std::allocator<double>_>::data
                                  ((vector<double,_std::allocator<double>_> *)0x17592f);
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)in_stack_fffffffffffff4a0._M_current);
            local_380 = std::vector<double,_std::allocator<double>_>::data
                                  ((vector<double,_std::allocator<double>_> *)0x17594c);
            std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    *)in_stack_fffffffffffff4a0._M_current);
            local_388 = std::vector<double,_std::allocator<double>_>::data
                                  ((vector<double,_std::allocator<double>_> *)0x175969);
            in_stack_fffffffffffff4b8 = &local_388;
            in_stack_fffffffffffff4b0._M_current = (double *)&local_380;
            in_stack_fffffffffffff4a8._M_current = (pair<double,_ExchCXX::XCKernel> *)&local_378;
            in_stack_fffffffffffff4a0._M_current = (pair<double,_ExchCXX::XCKernel> *)local_370;
            __rhs = (pair<double,_ExchCXX::XCKernel> *)(local_370 + 8);
            ExchCXX::XCKernel::
            eval_exc_vxc<unsigned_long&,double*,double*,double*,double*,double*,double*,double*,double*,double*>
                      (in_stack_fffffffffffff4e0,(unsigned_long *)in_stack_fffffffffffff4d8,
                       in_stack_fffffffffffff4d0,(double **)in_stack_fffffffffffff4c8,
                       (double **)in_stack_fffffffffffff4c0,in_stack_fffffffffffff4b8,
                       in_stack_fffffffffffff500,in_stack_fffffffffffff508,in_stack_fffffffffffff510
                       ,(double **)CONCAT17(in_stack_fffffffffffff51f,in_stack_fffffffffffff518),
                       in_stack_fffffffffffff520);
          }
        }
      }
    }
    std::pair<double,_ExchCXX::XCKernel>::~pair((pair<double,_ExchCXX::XCKernel> *)0x1759fd);
    __gnu_cxx::
    __normal_iterator<std::pair<double,_ExchCXX::XCKernel>_*,_std::vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>_>
    ::operator++(&local_268);
  }
  ExchCXX::XCFunctional::exc_buffer_len(&local_68,local_b8);
  std::allocator<double>::allocator((allocator<double> *)0x175a41);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff4c0,
             (size_type)in_stack_fffffffffffff4b8,
             (allocator_type *)in_stack_fffffffffffff4b0._M_current);
  std::allocator<double>::~allocator((allocator<double> *)0x175a6d);
  ExchCXX::XCFunctional::vrho_buffer_len
            ((XCFunctional *)in_stack_fffffffffffff4a0._M_current,(size_t)__rhs);
  std::allocator<double>::allocator((allocator<double> *)0x175a9f);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff4c0,
             (size_type)in_stack_fffffffffffff4b8,
             (allocator_type *)in_stack_fffffffffffff4b0._M_current);
  std::allocator<double>::~allocator((allocator<double> *)0x175acb);
  ExchCXX::XCFunctional::vsigma_buffer_len
            ((XCFunctional *)in_stack_fffffffffffff4a0._M_current,(size_t)__rhs);
  vsigma_00 = (host_buffer_type)local_3e1;
  std::allocator<double>::allocator((allocator<double> *)0x175afd);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff4c0,
             (size_type)in_stack_fffffffffffff4b8,
             (allocator_type *)in_stack_fffffffffffff4b0._M_current);
  std::allocator<double>::~allocator((allocator<double> *)0x175b29);
  sVar5 = ExchCXX::XCFunctional::vlapl_buffer_len
                    ((XCFunctional *)in_stack_fffffffffffff4a0._M_current,(size_t)__rhs);
  N_00 = (int)(sVar5 >> 0x20);
  this_00 = (XCFunctional *)local_401;
  std::allocator<double>::allocator((allocator<double> *)0x175b5b);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff4c0,
             (size_type)in_stack_fffffffffffff4b8,
             (allocator_type *)in_stack_fffffffffffff4b0._M_current);
  std::allocator<double>::~allocator((allocator<double> *)0x175b87);
  sigma_01 = (const_host_buffer_type)
             ExchCXX::XCFunctional::vtau_buffer_len
                       ((XCFunctional *)in_stack_fffffffffffff4a0._M_current,(size_t)__rhs);
  rho_00 = (const_host_buffer_type)local_421;
  std::allocator<double>::allocator((allocator<double> *)0x175bb9);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff4c0,
             (size_type)in_stack_fffffffffffff4b8,
             (allocator_type *)in_stack_fffffffffffff4b0._M_current);
  std::allocator<double>::~allocator((allocator<double> *)0x175be5);
  uVar3 = ExchCXX::XCFunctional::is_lda((XCFunctional *)in_stack_fffffffffffff4b0._M_current);
  if ((bool)uVar3) {
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x175c26);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x175c3b);
    std::vector<double,_std::allocator<double>_>::data
              ((vector<double,_std::allocator<double>_> *)0x175c50);
    ExchCXX::XCFunctional::eval_exc_vxc
              ((XCFunctional *)CONCAT44(in_stack_fffffffffffff5e4,in_stack_fffffffffffff5e0),N,
               in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8,in_stack_fffffffffffff5c0);
  }
  else {
    bVar2 = ExchCXX::XCFunctional::is_gga((XCFunctional *)in_stack_fffffffffffff4b0._M_current);
    if (bVar2) {
      std::vector<double,_std::allocator<double>_>::data
                ((vector<double,_std::allocator<double>_> *)0x175d96);
      std::vector<double,_std::allocator<double>_>::data
                ((vector<double,_std::allocator<double>_> *)0x175dab);
      std::vector<double,_std::allocator<double>_>::data
                ((vector<double,_std::allocator<double>_> *)0x175dc0);
      std::vector<double,_std::allocator<double>_>::data
                ((vector<double,_std::allocator<double>_> *)0x175dd5);
      pdVar6 = std::vector<double,_std::allocator<double>_>::data
                         ((vector<double,_std::allocator<double>_> *)0x175dea);
      uVar11 = SUB84(pdVar6,0);
      uVar12 = (undefined4)((ulong)pdVar6 >> 0x20);
      ExchCXX::XCFunctional::eval_exc_vxc
                (this_00,N_00,rho_00,sigma_01,
                 (host_buffer_type)CONCAT17(uVar3,in_stack_fffffffffffff620),
                 in_stack_fffffffffffff618,vsigma_00);
      __rhs = (pair<double,_ExchCXX::XCKernel> *)CONCAT44(uVar12,uVar11);
    }
    else {
      bVar2 = ExchCXX::XCFunctional::is_mgga((XCFunctional *)in_stack_fffffffffffff4b0._M_current);
      if (bVar2) {
        std::vector<double,_std::allocator<double>_>::data
                  ((vector<double,_std::allocator<double>_> *)0x175e6f);
        std::vector<double,_std::allocator<double>_>::data
                  ((vector<double,_std::allocator<double>_> *)0x175e84);
        std::vector<double,_std::allocator<double>_>::data
                  ((vector<double,_std::allocator<double>_> *)0x175e99);
        std::vector<double,_std::allocator<double>_>::data
                  ((vector<double,_std::allocator<double>_> *)0x175eae);
        pdVar7 = std::vector<double,_std::allocator<double>_>::data
                           ((vector<double,_std::allocator<double>_> *)0x175ec3);
        in_stack_fffffffffffff4a0._M_current =
             (pair<double,_ExchCXX::XCKernel> *)
             std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x175ed8);
        in_stack_fffffffffffff4a8._M_current =
             (pair<double,_ExchCXX::XCKernel> *)
             std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x175eed);
        in_stack_fffffffffffff4b0._M_current =
             std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x175f02);
        in_stack_fffffffffffff4b8 =
             (double **)
             std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)0x175f12);
        uVar11 = SUB84(pdVar7,0);
        uVar12 = (undefined4)((ulong)pdVar7 >> 0x20);
        ExchCXX::XCFunctional::eval_exc_vxc
                  (this_01,N_01,pdVar6,sigma_00,lapl_00,tau_00,(host_buffer_type)eps_00,
                   (host_buffer_type)aVar4.coeffs,(host_buffer_type)vsigma_01,
                   in_stack_fffffffffffff728,in_stack_fffffffffffff730);
        __rhs = (pair<double,_ExchCXX::XCKernel> *)CONCAT44(uVar12,uVar11);
      }
    }
  }
  for (local_430 = 0; uVar14 = local_430,
      sVar8 = std::vector<double,_std::allocator<double>_>::size(&local_3a0), uVar14 < sVar8;
      local_430 = local_430 + 1) {
    local_438 = 0.0;
    for (local_440 = 0; uVar14 = local_440,
        sVar8 = std::
                vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                ::size(local_50), uVar14 < sVar8; local_440 = local_440 + 1) {
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](&local_90,local_440);
      dVar1 = *pvVar9;
      pvVar10 = std::
                vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                ::operator[](&local_1f8,local_440);
      pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar10,local_430);
      local_438 = dVar1 * *pvVar9 + local_438;
    }
    local_498 = operator____catch_sr((char *)in_stack_fffffffffffff4a0._M_current,(size_t)__rhs);
    Catch::SourceLineInfo::SourceLineInfo
              (&local_4a8,
               "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]ExchCXX/test/xc_functional_test.cxx"
               ,400);
    uVar12 = (undefined4)((ulong)__rhs >> 0x20);
    local_4b8 = operator____catch_sr((char *)in_stack_fffffffffffff4a0._M_current,(size_t)__rhs);
    uVar11 = 2;
    macroName.m_size = (size_type)in_stack_fffffffffffff4c0;
    macroName.m_start = (char *)in_stack_fffffffffffff4b8;
    capturedExpression.m_size = (size_type)in_stack_fffffffffffff4b0._M_current;
    capturedExpression.m_start = (char *)in_stack_fffffffffffff4a8._M_current;
    Catch::AssertionHandler::AssertionHandler
              ((AssertionHandler *)in_stack_fffffffffffff4a0._M_current,macroName,
               (SourceLineInfo *)CONCAT44(uVar12,2),capturedExpression,
               (Flags)in_stack_fffffffffffff4d0);
    std::vector<double,_std::allocator<double>_>::operator[](&local_3a0,local_430);
    local_4f0 = (double)Catch::operator<=<double,_0>
                                  ((Decomposer *)CONCAT44(uVar12,uVar11),7.57030603643312e-318);
    Catch::Approx::Approx
              ((Approx *)in_stack_fffffffffffff4a0._M_current,(double)CONCAT44(uVar12,uVar11));
    Catch::operator==(in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0);
    Catch::AssertionHandler::handleExpr
              ((AssertionHandler *)in_stack_fffffffffffff4a0._M_current,
               (ITransientExpression *)CONCAT44(uVar12,uVar11));
    Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffff4a0._M_current);
    Catch::AssertionHandler::~AssertionHandler
              ((AssertionHandler *)in_stack_fffffffffffff4a0._M_current);
    __rhs = (pair<double,_ExchCXX::XCKernel> *)CONCAT44(uVar12,uVar11);
  }
  if (local_14 != 0) {
    for (local_520 = 0; uVar14 = local_520,
        sVar8 = std::vector<double,_std::allocator<double>_>::size(&local_3c0), uVar14 < sVar8;
        local_520 = local_520 + 1) {
      local_528 = 0.0;
      for (local_530 = 0; uVar14 = local_530,
          sVar8 = std::
                  vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                  ::size(local_50), uVar14 < sVar8; local_530 = local_530 + 1) {
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](&local_90,local_530);
        dVar1 = *pvVar9;
        pvVar10 = std::
                  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::operator[](&local_210,local_530);
        pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar10,local_520);
        local_528 = dVar1 * *pvVar9 + local_528;
      }
      local_588 = operator____catch_sr((char *)in_stack_fffffffffffff4a0._M_current,(size_t)__rhs);
      Catch::SourceLineInfo::SourceLineInfo
                (&local_598,
                 "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]ExchCXX/test/xc_functional_test.cxx"
                 ,0x199);
      uVar12 = (undefined4)((ulong)__rhs >> 0x20);
      local_5a8 = operator____catch_sr((char *)in_stack_fffffffffffff4a0._M_current,(size_t)__rhs);
      uVar11 = 2;
      macroName_00.m_size = (size_type)in_stack_fffffffffffff4c0;
      macroName_00.m_start = (char *)in_stack_fffffffffffff4b8;
      capturedExpression_00.m_size = (size_type)in_stack_fffffffffffff4b0._M_current;
      capturedExpression_00.m_start = (char *)in_stack_fffffffffffff4a8._M_current;
      Catch::AssertionHandler::AssertionHandler
                ((AssertionHandler *)in_stack_fffffffffffff4a0._M_current,macroName_00,
                 (SourceLineInfo *)CONCAT44(uVar12,2),capturedExpression_00,
                 (Flags)in_stack_fffffffffffff4d0);
      std::vector<double,_std::allocator<double>_>::operator[](&local_3c0,local_520);
      local_5e0 = (double)Catch::operator<=<double,_0>
                                    ((Decomposer *)CONCAT44(uVar12,uVar11),7.57414986715777e-318);
      Catch::Approx::Approx
                ((Approx *)in_stack_fffffffffffff4a0._M_current,(double)CONCAT44(uVar12,uVar11));
      Catch::operator==(in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0);
      Catch::AssertionHandler::handleExpr
                ((AssertionHandler *)in_stack_fffffffffffff4a0._M_current,
                 (ITransientExpression *)CONCAT44(uVar12,uVar11));
      Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffff4a0._M_current);
      Catch::AssertionHandler::~AssertionHandler
                ((AssertionHandler *)in_stack_fffffffffffff4a0._M_current);
      __rhs = (pair<double,_ExchCXX::XCKernel> *)CONCAT44(uVar12,uVar11);
    }
    bVar2 = ExchCXX::XCFunctional::is_gga((XCFunctional *)in_stack_fffffffffffff4b0._M_current);
    if (bVar2) {
      for (local_610 = 0; uVar14 = local_610,
          sVar8 = std::vector<double,_std::allocator<double>_>::size
                            ((vector<double,_std::allocator<double>_> *)(local_3e1 + 1)),
          uVar14 < sVar8; local_610 = local_610 + 1) {
        local_618 = 0.0;
        for (local_620 = 0; uVar14 = local_620,
            sVar8 = std::
                    vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                    ::size(local_50), uVar14 < sVar8; local_620 = local_620 + 1) {
          std::
          vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
          ::operator[](local_50,local_620);
          bVar2 = ExchCXX::XCKernel::is_gga((XCKernel *)0x176652);
          if (bVar2) {
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](&local_90,local_620);
            dVar1 = *pvVar9;
            pvVar10 = std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::operator[](&local_228,local_620);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar10,local_610);
            local_618 = dVar1 * *pvVar9 + local_618;
          }
        }
        local_678 = operator____catch_sr((char *)in_stack_fffffffffffff4a0._M_current,(size_t)__rhs)
        ;
        Catch::SourceLineInfo::SourceLineInfo
                  (&local_688,
                   "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]ExchCXX/test/xc_functional_test.cxx"
                   ,0x1a3);
        uVar12 = (undefined4)((ulong)__rhs >> 0x20);
        local_698 = operator____catch_sr((char *)in_stack_fffffffffffff4a0._M_current,(size_t)__rhs)
        ;
        uVar11 = 2;
        macroName_01.m_size = (size_type)in_stack_fffffffffffff4c0;
        macroName_01.m_start = (char *)in_stack_fffffffffffff4b8;
        capturedExpression_01.m_size = (size_type)in_stack_fffffffffffff4b0._M_current;
        capturedExpression_01.m_start = (char *)in_stack_fffffffffffff4a8._M_current;
        Catch::AssertionHandler::AssertionHandler
                  ((AssertionHandler *)in_stack_fffffffffffff4a0._M_current,macroName_01,
                   (SourceLineInfo *)CONCAT44(uVar12,2),capturedExpression_01,
                   (Flags)in_stack_fffffffffffff4d0);
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(local_3e1 + 1),local_610);
        local_6d0 = (double)Catch::operator<=<double,_0>
                                      ((Decomposer *)CONCAT44(uVar12,uVar11),7.57831484055221e-318);
        Catch::Approx::Approx
                  ((Approx *)in_stack_fffffffffffff4a0._M_current,(double)CONCAT44(uVar12,uVar11));
        Catch::operator==(in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0);
        Catch::AssertionHandler::handleExpr
                  ((AssertionHandler *)in_stack_fffffffffffff4a0._M_current,
                   (ITransientExpression *)CONCAT44(uVar12,uVar11));
        Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffff4a0._M_current);
        Catch::AssertionHandler::~AssertionHandler
                  ((AssertionHandler *)in_stack_fffffffffffff4a0._M_current);
        __rhs = (pair<double,_ExchCXX::XCKernel> *)CONCAT44(uVar12,uVar11);
      }
    }
    bVar2 = ExchCXX::XCFunctional::is_mgga((XCFunctional *)in_stack_fffffffffffff4b0._M_current);
    if (bVar2) {
      local_700 = 0;
      while (uVar14 = local_700,
            sVar8 = std::vector<double,_std::allocator<double>_>::size
                              ((vector<double,_std::allocator<double>_> *)(local_401 + 1)),
            uVar14 < sVar8) {
        local_708 = 0.0;
        local_710 = 0;
        while (uVar14 = local_710,
              sVar8 = std::
                      vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                      ::size(local_50), uVar14 < sVar8) {
          std::
          vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
          ::operator[](local_50,local_710);
          bVar2 = ExchCXX::XCKernel::needs_laplacian((XCKernel *)0x176993);
          if (bVar2) {
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](&local_90,local_710);
            vVar13 = *pvVar9;
            pvVar10 = std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::operator[](&local_240,local_710);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar10,local_700);
            local_708 = vVar13 * *pvVar9 + local_708;
          }
          local_710 = local_710 + 1;
        }
        local_768 = operator____catch_sr((char *)in_stack_fffffffffffff4a0._M_current,(size_t)__rhs)
        ;
        Catch::SourceLineInfo::SourceLineInfo
                  (&local_778,
                   "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]ExchCXX/test/xc_functional_test.cxx"
                   ,0x1ad);
        uVar12 = (undefined4)((ulong)__rhs >> 0x20);
        local_788 = operator____catch_sr((char *)in_stack_fffffffffffff4a0._M_current,(size_t)__rhs)
        ;
        uVar11 = 2;
        macroName_02.m_size = (size_type)in_stack_fffffffffffff4c0;
        macroName_02.m_start = (char *)in_stack_fffffffffffff4b8;
        capturedExpression_02.m_size = (size_type)in_stack_fffffffffffff4b0._M_current;
        capturedExpression_02.m_start = (char *)in_stack_fffffffffffff4a8._M_current;
        Catch::AssertionHandler::AssertionHandler
                  ((AssertionHandler *)in_stack_fffffffffffff4a0._M_current,macroName_02,
                   (SourceLineInfo *)CONCAT44(uVar12,2),capturedExpression_02,
                   (Flags)in_stack_fffffffffffff4d0);
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(local_401 + 1),local_700);
        local_7c0 = (double)Catch::operator<=<double,_0>
                                      ((Decomposer *)CONCAT44(uVar12,uVar11),7.58237111950457e-318);
        Catch::Approx::Approx
                  ((Approx *)in_stack_fffffffffffff4a0._M_current,(double)CONCAT44(uVar12,uVar11));
        Catch::operator==(in_stack_fffffffffffff4c8,in_stack_fffffffffffff4c0);
        Catch::AssertionHandler::handleExpr
                  ((AssertionHandler *)in_stack_fffffffffffff4a0._M_current,
                   (ITransientExpression *)CONCAT44(uVar12,uVar11));
        Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffff4a0._M_current);
        Catch::AssertionHandler::~AssertionHandler
                  ((AssertionHandler *)in_stack_fffffffffffff4a0._M_current);
        __rhs = (pair<double,_ExchCXX::XCKernel> *)CONCAT44(uVar12,uVar11);
        local_700 = local_700 + 1;
      }
      local_7f0 = 0;
      while (uVar14 = local_7f0,
            sVar8 = std::vector<double,_std::allocator<double>_>::size
                              ((vector<double,_std::allocator<double>_> *)(local_421 + 1)),
            uVar14 < sVar8) {
        local_7f8 = 0.0;
        local_800 = 0;
        while (uVar14 = local_800,
              sVar8 = std::
                      vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
                      ::size(local_50), uVar14 < sVar8) {
          std::
          vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
          ::operator[](local_50,local_800);
          bVar2 = ExchCXX::XCKernel::is_mgga((XCKernel *)0x176c9a);
          if (bVar2) {
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](&local_90,local_800);
            vVar13 = *pvVar9;
            pvVar10 = std::
                      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ::operator[](&local_258,local_800);
            pvVar9 = std::vector<double,_std::allocator<double>_>::operator[](pvVar10,local_7f0);
            local_7f8 = vVar13 * *pvVar9 + local_7f8;
          }
          local_800 = local_800 + 1;
        }
        local_858 = operator____catch_sr((char *)in_stack_fffffffffffff4a0._M_current,(size_t)__rhs)
        ;
        this = &local_868;
        Catch::SourceLineInfo::SourceLineInfo
                  (this,
                   "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]ExchCXX/test/xc_functional_test.cxx"
                   ,0x1b5);
        resultDisposition = (Flags)this;
        uVar12 = (undefined4)((ulong)__rhs >> 0x20);
        operator____catch_sr((char *)in_stack_fffffffffffff4a0._M_current,(size_t)__rhs);
        uVar11 = 2;
        macroName_03.m_size = (size_type)in_stack_fffffffffffff4c0;
        macroName_03.m_start = (char *)in_stack_fffffffffffff4b8;
        capturedExpression_03.m_size = (size_type)in_stack_fffffffffffff4b0._M_current;
        capturedExpression_03.m_start = (char *)in_stack_fffffffffffff4a8._M_current;
        Catch::AssertionHandler::AssertionHandler
                  ((AssertionHandler *)in_stack_fffffffffffff4a0._M_current,macroName_03,
                   (SourceLineInfo *)CONCAT44(uVar12,2),capturedExpression_03,resultDisposition);
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(local_421 + 1),local_7f0);
        lhs = Catch::operator<=<double,_0>
                        ((Decomposer *)CONCAT44(uVar12,uVar11),7.58620012825984e-318);
        Catch::Approx::Approx
                  ((Approx *)in_stack_fffffffffffff4a0._M_current,(double)CONCAT44(uVar12,uVar11));
        Catch::operator==((ExprLhs<double> *)lhs.m_lhs,in_stack_fffffffffffff4c0);
        Catch::AssertionHandler::handleExpr
                  ((AssertionHandler *)in_stack_fffffffffffff4a0._M_current,
                   (ITransientExpression *)CONCAT44(uVar12,uVar11));
        Catch::AssertionHandler::complete((AssertionHandler *)in_stack_fffffffffffff4a0._M_current);
        Catch::AssertionHandler::~AssertionHandler
                  ((AssertionHandler *)in_stack_fffffffffffff4a0._M_current);
        __rhs = (pair<double,_ExchCXX::XCKernel> *)CONCAT44(uVar12,uVar11);
        local_7f0 = local_7f0 + 1;
      }
    }
  }
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff4b0._M_current);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff4b0._M_current);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff4b0._M_current);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff4b0._M_current);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff4b0._M_current);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)in_stack_fffffffffffff4b0._M_current);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)in_stack_fffffffffffff4b0._M_current);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)in_stack_fffffffffffff4b0._M_current);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)in_stack_fffffffffffff4b0._M_current);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)in_stack_fffffffffffff4b0._M_current);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff4b0._M_current);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff4b0._M_current);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff4b0._M_current);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff4b0._M_current);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff4b0._M_current);
  ExchCXX::XCFunctional::~XCFunctional((XCFunctional *)0x176fda);
  std::
  vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
  ::~vector((vector<std::pair<double,_ExchCXX::XCKernel>,_std::allocator<std::pair<double,_ExchCXX::XCKernel>_>_>
             *)in_stack_fffffffffffff4b0._M_current);
  return;
}

Assistant:

void check_correctness( TestInterface interface, Backend backend, Spin polar, 
  Args&&... args ) {

  auto kern_pairs = gen_kern_vector( backend, polar, std::forward<Args>(args)... );
  XCFunctional func( kern_pairs );

  std::vector<double> coeffs;
  std::for_each( kern_pairs.begin(), kern_pairs.end(), 
    [&](const auto& a){ coeffs.emplace_back( a.first ); } 
  );

  size_t npts = 1024;

  std::vector<double>
    rho( func.rho_buffer_len(npts) ),
    sigma( func.sigma_buffer_len(npts) ),
    lapl( func.lapl_buffer_len(npts) ),
    tau( func.tau_buffer_len(npts) );

  // Randomly generate Rho / Sigma
  std::default_random_engine gen;
  std::normal_distribution<> dist(5.0,2.0);
  std::generate( rho.begin(), rho.end(), 
    [&](){ return dist(gen); } );
  std::generate( sigma.begin(), sigma.end(), 
    [&](){ return dist(gen); } );
  std::generate( lapl.begin(), lapl.end(), 
    [&](){ return dist(gen); } );
  std::generate( tau.begin(), tau.end(), 
    [&](){ return dist(gen); } );


  // Evaluate individual kernels
  std::vector< std::vector<double> >
    eps_refs, vrho_refs, vsigma_refs, vlapl_refs, vtau_refs;

  for( auto p : kern_pairs ) {

    XCKernel& kern = p.second;
    //double    f    = p.first;

    eps_refs.emplace_back( kern.exc_buffer_len(npts) );
    vrho_refs.emplace_back( kern.vrho_buffer_len(npts) );
    vsigma_refs.emplace_back( kern.vsigma_buffer_len(npts) );
    vlapl_refs.emplace_back( kern.vlapl_buffer_len(npts) );
    vtau_refs.emplace_back( kern.vtau_buffer_len(npts) );

    if( interface == TestInterface::EXC ) {

      if( kern.is_lda() )
        kern.eval_exc( npts, rho.data(), eps_refs.back().data() );
      else if( kern.is_gga() )
        kern.eval_exc( npts, rho.data(), sigma.data(), 
          eps_refs.back().data() );
      else if( kern.is_mgga() )
        kern.eval_exc( npts, rho.data(), sigma.data(), lapl.data(), tau.data(),
          eps_refs.back().data() );

    } else if( interface == TestInterface::EXC_VXC ) {

      if( kern.is_lda() )
        kern.eval_exc_vxc( npts, rho.data(), eps_refs.back().data(), 
          vrho_refs.back().data() );
      else if( kern.is_gga() )
        kern.eval_exc_vxc( npts, rho.data(), sigma.data(), 
          eps_refs.back().data(), vrho_refs.back().data(),
          vsigma_refs.back().data() );
      else if( kern.is_mgga() )
        kern.eval_exc_vxc( npts, rho.data(), sigma.data(), 
          lapl.data(), tau.data(), eps_refs.back().data(), 
          vrho_refs.back().data(), vsigma_refs.back().data(),
          vlapl_refs.back().data(), vtau_refs.back().data() );

    }
    
  }

  
  // Evaluation combined functional
  std::vector<double>
    eps( func.exc_buffer_len( npts ) ),
    vrho( func.vrho_buffer_len( npts ) ),
    vsigma( func.vsigma_buffer_len( npts ) ),
    vlapl( func.vlapl_buffer_len( npts ) ),
    vtau( func.vtau_buffer_len( npts ) );

  if( func.is_lda() )
    func.eval_exc_vxc( npts, rho.data(), eps.data(), vrho.data() );
  else if( func.is_gga() )
    func.eval_exc_vxc( npts, rho.data(), sigma.data(), 
      eps.data(), vrho.data(), vsigma.data() );
  else if( func.is_mgga() )
    func.eval_exc_vxc( npts, rho.data(), sigma.data(), 
      lapl.data(), tau.data(), eps.data(), vrho.data(), 
      vsigma.data(), vlapl.data(), vtau.data() );


  for( auto i = 0ul; i < eps.size(); ++i ) {
    double ref_val = 0.;
    for( auto j = 0ul; j < kern_pairs.size(); ++j )
      ref_val += coeffs[j] * eps_refs[j][i];
    CHECK( eps[i] == Approx( ref_val ) );
  }

  if( interface != TestInterface::EXC ) {

    for( auto i = 0ul; i < vrho.size(); ++i ) {
      double ref_val = 0.;
      for( auto j = 0ul; j < kern_pairs.size(); ++j )
        ref_val += coeffs[j] * vrho_refs[j][i];
      CHECK( vrho[i] == Approx( ref_val ) );
    }

    if( func.is_gga() ) 
      for( auto i = 0ul; i < vsigma.size(); ++i ) {
        double ref_val = 0.;
        for( auto j = 0ul; j < kern_pairs.size(); ++j )
        if( kern_pairs[j].second.is_gga() )
          ref_val += coeffs[j] * vsigma_refs[j][i];

        CHECK( vsigma[i] == Approx( ref_val ) );
      }

    if( func.is_mgga() )  {
      for( auto i = 0ul; i < vlapl.size(); ++i ) {
        double ref_val = 0.;
        for( auto j = 0ul; j < kern_pairs.size(); ++j )
        if( kern_pairs[j].second.needs_laplacian() )
          ref_val += coeffs[j] * vlapl_refs[j][i];

        CHECK( vlapl[i] == Approx( ref_val ) );
      }
      for( auto i = 0ul; i < vtau.size(); ++i ) {
        double ref_val = 0.;
        for( auto j = 0ul; j < kern_pairs.size(); ++j )
        if( kern_pairs[j].second.is_mgga() )
          ref_val += coeffs[j] * vtau_refs[j][i];

        CHECK( vtau[i] == Approx( ref_val ) );
      }
    }

  }

}